

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InliningDecider.cpp
# Opt level: O0

void InliningDecider::TraceInlining
               (FunctionBody *inliner,char16 *inlineeName,char16 *inlineeFunctionIdandNumberString,
               uint inlineeByteCodeCount,FunctionBody *topFunc,uint inlinedByteCodeCount,
               FunctionBody *inlinee,uint callSiteId,bool inLoopBody,bool isCallback,uint builtIn)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  LocalFunctionId LVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  undefined4 *puVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  char16_t *pcVar13;
  char16_t *pcVar14;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  char16 *pcVar15;
  undefined4 extraout_var_07;
  char16 *pcVar16;
  undefined4 extraout_var_08;
  char16 *pcVar17;
  undefined8 in_stack_fffffffffffffd38;
  undefined4 uVar18;
  undefined8 in_stack_fffffffffffffd40;
  undefined4 uVar19;
  undefined8 in_stack_fffffffffffffd48;
  undefined4 uVar21;
  undefined8 uVar20;
  undefined8 in_stack_fffffffffffffd50;
  undefined4 uVar23;
  undefined8 uVar22;
  undefined8 in_stack_fffffffffffffd58;
  undefined4 uVar24;
  char16 local_178 [2];
  int len;
  char16 debugStringBuffer3 [42];
  wchar local_118 [4];
  char16 debugStringBuffer2 [42];
  wchar local_b8 [4];
  char16 debugStringBuffer [42];
  bool isCallback_local;
  bool inLoopBody_local;
  uint inlinedByteCodeCount_local;
  FunctionBody *topFunc_local;
  uint inlineeByteCodeCount_local;
  char16 *inlineeFunctionIdandNumberString_local;
  char16 *inlineeName_local;
  FunctionBody *inliner_local;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  uVar24 = (undefined4)((ulong)in_stack_fffffffffffffd58 >> 0x20);
  uVar19 = (undefined4)((ulong)in_stack_fffffffffffffd40 >> 0x20);
  uVar18 = (undefined4)((ulong)in_stack_fffffffffffffd38 >> 0x20);
  uVar23 = (undefined4)((ulong)in_stack_fffffffffffffd50 >> 0x20);
  uVar21 = (undefined4)((ulong)in_stack_fffffffffffffd48 >> 0x20);
  debugStringBuffer[0x29]._1_1_ = inLoopBody;
  debugStringBuffer[0x29]._0_1_ = isCallback;
  inlineeFunctionIdandNumberString_local = inlineeName;
  if (inlineeName == (char16 *)0x0) {
    iVar3 = swprintf_s((char16_t_conflict *)local_178,0x2a,(char16_t_conflict *)L"built In Id: %u",
                       (ulong)builtIn);
    if (iVar3 < 0xf) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningDecider.cpp"
                         ,0x3b5,"(len > 14)","len > 14");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    inlineeFunctionIdandNumberString_local = local_178;
  }
  uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)topFunc);
  LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)topFunc);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,InlinePhase,uVar4,LVar5);
  if (bVar2) {
    pcVar13 = L"";
    if (((byte)debugStringBuffer[0x29] & 1) != 0) {
      pcVar13 = L" CALLBACK";
    }
    pcVar14 = L"";
    if ((debugStringBuffer[0x29]._1_1_ & 1) != 0) {
      pcVar14 = L" IN LOOP BODY";
    }
    iVar3 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
    uVar11 = CONCAT44(extraout_var,iVar3);
    pcVar15 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)inliner,(wchar (*) [42])local_b8);
    uVar4 = Js::FunctionBody::GetByteCodeCount(inliner);
    iVar3 = (*(topFunc->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
    uVar12 = CONCAT44(extraout_var_00,iVar3);
    pcVar16 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)topFunc,(wchar (*) [42])local_118);
    uVar6 = Js::FunctionBody::GetByteCodeCount(topFunc);
    uVar20 = CONCAT44(uVar21,uVar4);
    uVar22 = CONCAT44(uVar23,inlinedByteCodeCount);
    Output::Print(L"INLINING%s %s: Inlinee: %s (%s)\tSize: %d\tCaller: %s (%s)\tSize: %d\tInlineCount: %d\tRoot: %s (%s)\tSize: %d\tCallSiteId: %d\n"
                  ,pcVar13,pcVar14,inlineeFunctionIdandNumberString_local,
                  inlineeFunctionIdandNumberString,(ulong)inlineeByteCodeCount,uVar11,pcVar15,uVar20
                  ,uVar22,uVar12,pcVar16,uVar6,callSiteId);
    uVar24 = (undefined4)((ulong)uVar12 >> 0x20);
    uVar19 = (undefined4)((ulong)pcVar15 >> 0x20);
    uVar18 = (undefined4)((ulong)uVar11 >> 0x20);
    uVar23 = (undefined4)((ulong)uVar22 >> 0x20);
    uVar21 = (undefined4)((ulong)uVar20 >> 0x20);
  }
  uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)topFunc);
  LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)topFunc);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlinePhase,uVar4,LVar5);
  if (bVar2) {
    pcVar13 = L"";
    if (((byte)debugStringBuffer[0x29] & 1) != 0) {
      pcVar13 = L" CALLBACK";
    }
    pcVar14 = L"";
    if ((debugStringBuffer[0x29]._1_1_ & 1) != 0) {
      pcVar14 = L" IN LOOP BODY";
    }
    iVar3 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
    uVar11 = CONCAT44(extraout_var_01,iVar3);
    pcVar15 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)inliner,(wchar (*) [42])local_b8);
    uVar4 = Js::FunctionBody::GetByteCodeCount(inliner);
    iVar3 = (*(topFunc->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
    uVar12 = CONCAT44(extraout_var_02,iVar3);
    pcVar16 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)topFunc,(wchar (*) [42])local_118);
    uVar6 = Js::FunctionBody::GetByteCodeCount(topFunc);
    Output::Print(L"INLINING%s %s: Inlinee: %s (%s)\tSize: %d\tCaller: %s (%s)\tSize: %d\tInlineCount: %d\tRoot: %s (%s)\tSize: %d\tCallSiteId: %d\n"
                  ,pcVar13,pcVar14,inlineeFunctionIdandNumberString_local,
                  inlineeFunctionIdandNumberString,(ulong)inlineeByteCodeCount,uVar11,pcVar15,
                  CONCAT44(uVar21,uVar4),CONCAT44(uVar23,inlinedByteCodeCount),uVar12,pcVar16,uVar6,
                  callSiteId);
    uVar24 = (undefined4)((ulong)uVar12 >> 0x20);
    uVar19 = (undefined4)((ulong)pcVar15 >> 0x20);
    uVar18 = (undefined4)((ulong)uVar11 >> 0x20);
    Output::Flush();
  }
  if (builtIn == 0xffffffff) {
    if ((inliner == (FunctionBody *)0x0) || (inlinee == (FunctionBody *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningDecider.cpp"
                         ,0x3c9,"(inliner && inlinee)","inliner && inlinee");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inliner);
    uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inlinee);
    if (uVar4 != uVar6) {
      uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)topFunc);
      LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)topFunc);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,InlinePhase,uVar4,LVar5);
      if (bVar2) {
        iVar3 = (*(inlinee->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject
                  .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
        pcVar15 = Js::FunctionProxy::GetDebugNumberSet
                            ((FunctionProxy *)inlinee,(wchar (*) [42])local_b8);
        uVar4 = Js::FunctionBody::GetByteCodeCount(inlinee);
        iVar7 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject
                  .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
        pcVar16 = Js::FunctionProxy::GetDebugNumberSet
                            ((FunctionProxy *)inliner,(wchar (*) [42])local_118);
        uVar6 = Js::FunctionBody::GetByteCodeCount(inliner);
        iVar8 = (*(topFunc->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject
                  .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
        pcVar17 = Js::FunctionProxy::GetDebugNumberSet
                            ((FunctionProxy *)topFunc,(wchar (*) [42])local_178);
        uVar9 = Js::FunctionBody::GetByteCodeCount(topFunc);
        uVar11 = CONCAT44(uVar18,uVar6);
        uVar12 = CONCAT44(uVar19,inlinedByteCodeCount);
        uVar20 = CONCAT44(uVar24,uVar9);
        Output::Print(L"INLINING_ACROSS_FILES: Inlinee: %s (%s)\tSize: %d\tCaller: %s (%s)\tSize: %d\tInlineCount: %d\tRoot: %s (%s)\tSize: %d\n"
                      ,CONCAT44(extraout_var_03,iVar3),pcVar15,(ulong)uVar4,
                      CONCAT44(extraout_var_04,iVar7),pcVar16,uVar11,uVar12,
                      CONCAT44(extraout_var_05,iVar8),pcVar17,uVar20);
        uVar24 = (undefined4)((ulong)uVar20 >> 0x20);
        uVar19 = (undefined4)((ulong)uVar12 >> 0x20);
        uVar18 = (undefined4)((ulong)uVar11 >> 0x20);
      }
      uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)topFunc);
      LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)topFunc);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlinePhase,uVar4,LVar5);
      if (bVar2) {
        iVar3 = (*(inlinee->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject
                  .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
        pcVar15 = Js::FunctionProxy::GetDebugNumberSet
                            ((FunctionProxy *)inlinee,(wchar (*) [42])local_b8);
        uVar4 = Js::FunctionBody::GetByteCodeCount(inlinee);
        iVar7 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject
                  .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
        pcVar16 = Js::FunctionProxy::GetDebugNumberSet
                            ((FunctionProxy *)inliner,(wchar (*) [42])local_118);
        uVar6 = Js::FunctionBody::GetByteCodeCount(inliner);
        iVar8 = (*(topFunc->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject
                  .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
        pcVar17 = Js::FunctionProxy::GetDebugNumberSet
                            ((FunctionProxy *)topFunc,(wchar (*) [42])local_178);
        uVar9 = Js::FunctionBody::GetByteCodeCount(topFunc);
        Output::Print(L"INLINING_ACROSS_FILES: Inlinee: %s (%s)\tSize: %d\tCaller: %s (%s)\tSize: %d\tInlineCount: %d\tRoot: %s (%s)\tSize: %d\n"
                      ,CONCAT44(extraout_var_06,iVar3),pcVar15,(ulong)uVar4,
                      CONCAT44(extraout_var_07,iVar7),pcVar16,CONCAT44(uVar18,uVar6),
                      CONCAT44(uVar19,inlinedByteCodeCount),CONCAT44(extraout_var_08,iVar8),pcVar17,
                      CONCAT44(uVar24,uVar9));
        Output::Flush();
      }
    }
  }
  return;
}

Assistant:

void InliningDecider::TraceInlining(Js::FunctionBody *const inliner, const char16* inlineeName, const char16* inlineeFunctionIdandNumberString, uint inlineeByteCodeCount,
    Js::FunctionBody* topFunc, uint inlinedByteCodeCount, Js::FunctionBody *const inlinee, uint callSiteId, bool inLoopBody, bool isCallback, uint builtIn)
{
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer3[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    if (inlineeName == nullptr)
    {
        int len = swprintf_s(debugStringBuffer3, MAX_FUNCTION_BODY_DEBUG_STRING_SIZE, _u("built In Id: %u"), builtIn);
        Assert(len > 14);
        inlineeName = debugStringBuffer3;
    }
    INLINE_TRACE_AND_TESTTRACE(_u("INLINING%s %s: Inlinee: %s (%s)\tSize: %d\tCaller: %s (%s)\tSize: %d\tInlineCount: %d\tRoot: %s (%s)\tSize: %d\tCallSiteId: %d\n"),
        isCallback ? _u(" CALLBACK") : _u(""),
        inLoopBody ? _u(" IN LOOP BODY") : _u(""),
        inlineeName, inlineeFunctionIdandNumberString, inlineeByteCodeCount,
        inliner->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer), inliner->GetByteCodeCount(),
        inlinedByteCodeCount,
        topFunc->GetDisplayName(), topFunc->GetDebugNumberSet(debugStringBuffer2), topFunc->GetByteCodeCount(),
        callSiteId
        );

    // Now Trace inlining across files cases

    if (builtIn != -1)  // built-in functions
    {
        return;
    }

    Assert(inliner && inlinee);

    if (inliner->GetSourceContextId() != inlinee->GetSourceContextId())
    {
        INLINE_TRACE_AND_TESTTRACE(_u("INLINING_ACROSS_FILES: Inlinee: %s (%s)\tSize: %d\tCaller: %s (%s)\tSize: %d\tInlineCount: %d\tRoot: %s (%s)\tSize: %d\n"),
            inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer), inlinee->GetByteCodeCount(),
            inliner->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer2), inliner->GetByteCodeCount(), inlinedByteCodeCount,
            topFunc->GetDisplayName(), topFunc->GetDebugNumberSet(debugStringBuffer3), topFunc->GetByteCodeCount()
            );
    }

}